

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O0

void __thiscall kratos::TestBench::add_port_name(TestBench *this,string *name)

{
  UserException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *name_local;
  TestBench *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_38,"Top-level testbench not allowed to have port ",local_18);
  UserException::UserException(this_00,&local_38);
  __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

void TestBench::add_port_name(const std::string &name) {
    throw UserException("Top-level testbench not allowed to have port " + name);
}